

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * monty_modsqrt(ModsqrtContext *sc,mp_int *x,uint *success)

{
  BignumInt **r;
  uint which;
  uint uVar1;
  mp_int *src;
  mp_int *b;
  ulong uStack_80;
  uint eq1;
  size_t j;
  size_t i;
  mp_int power_of_zk;
  mp_int tmp;
  mp_int xk;
  mp_int *toret;
  mp_int scratch;
  mp_int *scratch_to_free;
  uint *success_local;
  mp_int *x_local;
  ModsqrtContext *sc_local;
  
  modsqrt_lazy_setup(sc);
  scratch.w = &mp_make_sized(sc->mc->rw * 3)->nw;
  toret = (mp_int *)((mp_int *)scratch.w)->nw;
  scratch.nw = (size_t)((mp_int *)scratch.w)->w;
  src = monty_pow(sc->mc,x,sc->km1o2);
  join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&toret,sc->mc->rw);
  mp_copy_into((mp_int *)&tmp.w,src);
  monty_mul_into(sc->mc,src,src,x);
  monty_mul_into(sc->mc,(mp_int *)&tmp.w,src,(mp_int *)&tmp.w);
  join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&toret,sc->mc->rw);
  _i = mp_alloc_from_scratch((mp_int *)&toret,sc->mc->rw);
  mp_copy_into((mp_int *)&i,sc->zk);
  for (j = 0; j < sc->e; j = j + 1) {
    mp_copy_into((mp_int *)&power_of_zk.w,(mp_int *)&tmp.w);
    uStack_80 = j;
    while (uStack_80 = uStack_80 + 1, uStack_80 < sc->e) {
      r = &power_of_zk.w;
      monty_mul_into(sc->mc,(mp_int *)r,(mp_int *)r,(mp_int *)r);
    }
    b = monty_identity(sc->mc);
    which = mp_cmp_eq((mp_int *)&power_of_zk.w,b);
    if (j == 0) {
      uVar1 = mp_eq_integer(x,0);
      *success = which | uVar1;
    }
    else {
      monty_mul_into(sc->mc,(mp_int *)&power_of_zk.w,src,(mp_int *)&i);
      mp_select_into(src,(mp_int *)&power_of_zk.w,src,which);
      monty_mul_into(sc->mc,(mp_int *)&i,(mp_int *)&i,(mp_int *)&i);
      monty_mul_into(sc->mc,(mp_int *)&power_of_zk.w,(mp_int *)&tmp.w,(mp_int *)&i);
      mp_select_into((mp_int *)&tmp.w,(mp_int *)&power_of_zk.w,(mp_int *)&tmp.w,which);
    }
  }
  mp_free((mp_int *)scratch.w);
  return src;
}

Assistant:

mp_int *monty_modsqrt(ModsqrtContext *sc, mp_int *x, unsigned *success)
{
    modsqrt_lazy_setup(sc);

    mp_int *scratch_to_free = mp_make_sized(3 * sc->mc->rw);
    mp_int scratch = *scratch_to_free;

    /*
     * Compute toret = x^{(k+1)/2}, our starting point for the output
     * square root, and also xk = x^k which we'll use as we go along
     * for knowing when to apply correction factors. We do this by
     * first computing x^{(k-1)/2}, then multiplying it by x, then
     * multiplying the two together.
     */
    mp_int *toret = monty_pow(sc->mc, x, sc->km1o2);
    mp_int xk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&xk, toret);
    monty_mul_into(sc->mc, toret, toret, x);
    monty_mul_into(sc->mc, &xk, toret, &xk);

    mp_int tmp = mp_alloc_from_scratch(&scratch, sc->mc->rw);

    mp_int power_of_zk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&power_of_zk, sc->zk);

    for (size_t i = 0; i < sc->e; i++) {
        mp_copy_into(&tmp, &xk);
        for (size_t j = i+1; j < sc->e; j++)
            monty_mul_into(sc->mc, &tmp, &tmp, &tmp);
        unsigned eq1 = mp_cmp_eq(&tmp, monty_identity(sc->mc));

        if (i == 0) {
            /* One special case: if x=0, then no power of x will ever
             * equal 1, but we should still report success on the
             * grounds that 0 does have a square root mod p. */
            *success = eq1 | mp_eq_integer(x, 0);
        } else {
            monty_mul_into(sc->mc, &tmp, toret, &power_of_zk);
            mp_select_into(toret, &tmp, toret, eq1);

            monty_mul_into(sc->mc, &power_of_zk,
                           &power_of_zk, &power_of_zk);

            monty_mul_into(sc->mc, &tmp, &xk, &power_of_zk);
            mp_select_into(&xk, &tmp, &xk, eq1);
        }
    }

    mp_free(scratch_to_free);

    return toret;
}